

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplevm.cpp
# Opt level: O0

int32_t * Compile(string *src_code,size_t *rsz)

{
  char ch_00;
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  invalid_argument *this;
  int local_60;
  int32_t tmpop;
  int32_t tmpaddr;
  int nesting;
  int32_t op;
  uint32_t addr;
  int iStack_48;
  char ch;
  int i;
  int32_t count;
  char prevCh;
  size_t len;
  char *data;
  size_t sz;
  int32_t *program;
  size_t max_sz;
  size_t *rsz_local;
  string *src_code_local;
  
  max_sz = (size_t)rsz;
  rsz_local = (size_t *)src_code;
  lVar5 = std::__cxx11::string::length();
  program = (int32_t *)(lVar5 << 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = program;
  uVar6 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  sz = (size_t)operator_new__(uVar6);
  data = (char *)0x0;
  lVar5 = std::__cxx11::string::data();
  uVar6 = std::__cxx11::string::length();
  i._3_1_ = 'A';
  iStack_48 = 0;
  for (addr = 0; (ulong)(long)(int)addr < uVar6; addr = addr + 1) {
    ch_00 = *(char *)(lVar5 + (int)addr);
    switch(ch_00) {
    case '+':
    case '-':
    case '>':
    case '<':
      if (i._3_1_ == ch_00) {
        iStack_48 = iStack_48 + 1;
      }
      else {
        ConvertToBytecode(i._3_1_,iStack_48,(int32_t *)sz,(size_t *)&data);
        iStack_48 = 1;
        i._3_1_ = ch_00;
      }
      break;
    case '.':
    case ',':
    case '[':
    case ']':
      ConvertToBytecode(i._3_1_,iStack_48,(int32_t *)sz,(size_t *)&data);
      ConvertToBytecode(ch_00,0,(int32_t *)sz,(size_t *)&data);
      i._3_1_ = 'A';
      iStack_48 = 0;
    }
  }
  nesting = 0;
  do {
    if ((ulong)data >> 1 <= (ulong)(uint)nesting) {
      *(char **)max_sz = data;
      return (int32_t *)sz;
    }
    if (*(int *)(sz + (ulong)(uint)(nesting << 1) * 4) == 7) {
      tmpop = 1;
      iVar4 = nesting;
      do {
        while( true ) {
          iVar3 = iVar4;
          local_60 = iVar3 + 1;
          if ((ulong)data >> 1 <= (ulong)(long)local_60) goto LAB_00101624;
          iVar1 = *(int *)(sz + (long)(local_60 * 2) * 4);
          if (iVar1 != 7) break;
          tmpop = tmpop + 1;
          iVar4 = local_60;
        }
        iVar4 = local_60;
      } while ((iVar1 != 8) || (tmpop = tmpop + -1, iVar4 = local_60, tmpop != 0));
      *(int *)(sz + (ulong)(nesting * 2 + 1) * 4) = iVar3 + 2;
      *(int *)(sz + (long)(local_60 * 2 + 1) * 4) = nesting;
LAB_00101624:
      if (tmpop != 0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Un-matched [");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
    }
    nesting = nesting + 1;
  } while( true );
}

Assistant:

int32_t* Compile(const std::string& src_code, size_t *rsz) {
    size_t max_sz = src_code.length() * 2;
    int32_t *program = new int32_t[max_sz];
    size_t sz = 0;

    // compile the source code into vm bytecode
    const char* data = src_code.data();
    const size_t len = src_code.length();
    char prevCh = 'A';
    int32_t count = 0;
    for (int i = 0; i < len; i++) {
        char ch = data[i];
        switch (ch)
        {
            case '+':;
            case '-':;
            case '>':;
            case '<':;
                if (prevCh == ch) {
                    count++;
                } else {
                    ConvertToBytecode(prevCh, count, program, &sz);
                    prevCh = ch;
                    count = 1;
                }
                break;

            case '.':;
            case ',':;
            case '[':;
            case ']':
                ConvertToBytecode(prevCh, count, program, &sz);
                ConvertToBytecode(ch, 0, program, &sz);
                prevCh = 'A';
                count = 0;
                break;
        }
    }

    // pass two - set jz/jmp destination address
    for (uint32_t addr = 0; addr < sz / 2; addr++) {
        int32_t op = program[addr * 2];
        if (op != JZ) {
            continue;
        }

        int nesting = 1;
        for (int32_t tmpaddr = addr + 1; tmpaddr < sz / 2; tmpaddr++) {
            int32_t tmpop = program[tmpaddr * 2];
            if (tmpop == JZ) {
                nesting++;
            }
            else if (tmpop == JMP) {
                nesting--;
                if (nesting == 0) {
                    program[addr * 2 + 1] = tmpaddr + 1;
                    program[tmpaddr * 2 + 1] = addr;
                    break;
                }
            }
        }
        if (nesting != 0) {
            throw std::invalid_argument("Un-matched [");
        }
    }

    *rsz = sz;
    return program;
}